

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

int al_get_monitor_dpi(int adapter)

{
  int iVar1;
  ALLEGRO_SYSTEM *pAVar2;
  int in_EDI;
  ALLEGRO_SYSTEM *system;
  int local_4;
  
  pAVar2 = al_get_system_driver();
  iVar1 = al_get_num_video_adapters();
  if ((((in_EDI < iVar1) && (pAVar2 != (ALLEGRO_SYSTEM *)0x0)) &&
      (pAVar2->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (pAVar2->vt->get_monitor_dpi != (_func_int_int *)0x0)) {
    local_4 = (*pAVar2->vt->get_monitor_dpi)(in_EDI);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int al_get_monitor_dpi(int adapter)
{
   ALLEGRO_SYSTEM *system = al_get_system_driver();

   if (adapter < al_get_num_video_adapters()) {
       if (system && system->vt && system->vt->get_monitor_dpi) {
           return system->vt->get_monitor_dpi(adapter);
       }
   }

   return 0;
}